

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadBB3D(B3DImporter *this,aiScene *scene)

{
  pointer *ppaVar1;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *pvVar2;
  float fVar3;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar4;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar5;
  pointer pVVar6;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar7;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar8;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar9;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar10;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar11;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar12;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var13;
  iterator __position;
  pointer puVar14;
  aiAnimation *paVar15;
  undefined1 auVar16 [16];
  aiNode *paVar17;
  void *__src;
  undefined8 uVar18;
  bool bVar19;
  int iVar20;
  Logger *this_00;
  pointer puVar21;
  ulong uVar22;
  undefined8 *__s;
  undefined8 *__s_00;
  undefined8 *__s_01;
  aiNode *paVar23;
  aiVertexWeight *paVar24;
  aiMatrix4x4t<float> *paVar25;
  SharedPostProcessInfo *pSVar26;
  void *__dest;
  pointer ppaVar27;
  aiVertexWeight this_01;
  pointer puVar28;
  aiMaterial **ppaVar29;
  aiMesh **ppaVar30;
  aiNodeAnim **ppaVar31;
  aiAnimation **ppaVar32;
  ulong uVar33;
  pointer ppaVar34;
  pointer puVar35;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *this_02;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *this_03;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *this_04;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *this_05;
  B3DImporter *pBVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  SharedPostProcessInfo *pSVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  aiBone *bone;
  FlipWindingOrderProcess flip;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  MakeLeftHandedProcess makeleft;
  string t;
  aiNode *local_1c0;
  FlipWindingOrderProcess local_1b8;
  aiScene *local_1a0;
  long local_198;
  int local_18c;
  void *local_188;
  iterator iStack_180;
  aiBone **local_178;
  vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
  *local_168;
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  *local_160;
  undefined8 *local_158;
  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
  *local_150;
  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
  *local_148;
  ulong local_140;
  aiNode *local_138;
  ulong local_130;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_128;
  undefined8 *local_120;
  undefined1 local_118 [12];
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_textures);
  puVar4 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = puVar4;
  if (puVar5 != puVar4) {
    do {
      std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != puVar5);
    (this->_materials).
    super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  pVVar6 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vertices).
      super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar6) {
    (this->_vertices).
    super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar6;
  }
  puVar7 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = puVar7;
  if (puVar8 != puVar7) {
    do {
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != puVar8);
    (this->_meshes).
    super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  local_128 = &this->_nodes;
  DeleteAllBarePointers<aiNode*>(local_128);
  ppaVar27 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar27) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar27;
  }
  puVar9 = (this->_nodeAnims).
           super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->_nodeAnims).
            super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_04 = puVar9;
  if (puVar10 != puVar9) {
    do {
      std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != puVar10);
    (this->_nodeAnims).
    super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  puVar11 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_05 = puVar11;
  if (puVar12 != puVar11) {
    do {
      std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != puVar12);
    (this->_animations).
    super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  ReadChunk_abi_cxx11_(&local_50,this);
  iVar20 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar20 == 0) {
    uVar42 = ReadInt(this);
    bVar19 = DefaultLogger::isNullLogger();
    if (!bVar19) {
      snprintf(local_118,0x80,"B3D file format version: %i",(ulong)uVar42);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,local_118);
    }
    puVar21 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    uVar42 = puVar21[-1];
    if (uVar42 != this->_pos) {
      do {
        ReadChunk_abi_cxx11_((string *)local_118,this);
        iVar20 = std::__cxx11::string::compare((char *)local_118);
        if (iVar20 == 0) {
          ReadTEXS(this);
        }
        else {
          iVar20 = std::__cxx11::string::compare((char *)local_118);
          if (iVar20 == 0) {
            ReadBRUS(this);
          }
          else {
            iVar20 = std::__cxx11::string::compare((char *)local_118);
            if (iVar20 == 0) {
              ReadNODE(this,(aiNode *)0x0);
            }
          }
        }
        puVar21 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar42 = puVar21[-1];
        puVar21 = puVar21 + -1;
        this->_pos = uVar42;
        (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar21;
        if ((undefined1 *)local_118._0_8_ != local_108) {
          operator_delete((void *)local_118._0_8_);
          puVar21 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar42 = this->_pos;
        }
      } while (puVar21[-1] != uVar42);
    }
  }
  else {
    puVar21 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    uVar42 = puVar21[-1];
  }
  this->_pos = uVar42;
  (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar21 + -1;
  ppaVar27 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar34 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppaVar34 == ppaVar27) {
    local_70._0_8_ = local_70 + 0x10;
    pBVar36 = (B3DImporter *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar36,"No nodes","");
    Fail(pBVar36,(string *)local_70);
  }
  if ((this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_90._0_8_ = local_90 + 0x10;
    pBVar36 = (B3DImporter *)local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar36,"No meshes","");
    Fail(pBVar36,(string *)local_90);
  }
  local_168 = (vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
               *)&this->_materials;
  local_160 = &this->_meshes;
  local_148 = &this->_nodeAnims;
  local_150 = &this->_animations;
  uVar22 = 0;
  local_1a0 = scene;
  do {
    if (ppaVar27[uVar22]->mNumMeshes != 0) {
      uVar33 = 0;
      local_140 = uVar22;
      local_138 = ppaVar27[uVar22];
      do {
        _Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             (local_160->
             super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[local_138->mMeshes[uVar33]]._M_t.
             super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t;
        iVar20 = *(int *)((long)_Var13._M_t.
                                super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
        local_18c = iVar20 * 3;
        uVar37 = (ulong)local_18c;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar37;
        uVar22 = SUB168(auVar16 * ZEXT816(0xc),0);
        *(int *)((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = local_18c;
        if (SUB168(auVar16 * ZEXT816(0xc),8) != 0) {
          uVar22 = 0xffffffffffffffff;
        }
        local_130 = uVar33;
        __s = (undefined8 *)operator_new__(uVar22);
        if (iVar20 != 0) {
          memset(__s,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *(undefined8 **)
         ((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = __s;
        if ((this->_vflags & 1) == 0) {
          __s_00 = (undefined8 *)0x0;
        }
        else {
          __s_00 = (undefined8 *)operator_new__(uVar22);
          if (iVar20 != 0) {
            memset(__s_00,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(undefined8 **)
           ((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = __s_00;
        }
        if (this->_tcsets == 0) {
          __s_01 = (undefined8 *)0x0;
        }
        else {
          __s_01 = (undefined8 *)operator_new__(uVar22);
          if (iVar20 != 0) {
            memset(__s_01,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(undefined8 **)
           ((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70) = __s_01;
        }
        lVar40 = *(long *)((long)_Var13._M_t.
                                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  *)&local_1b8,
                 (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_118);
        if (0 < iVar20) {
          local_198 = 0;
          local_120 = __s_00;
          local_158 = __s_01;
          do {
            lVar38 = 0;
            do {
              uVar22 = (ulong)*(uint *)(*(long *)(lVar40 + 8) + lVar38 * 4);
              pVVar6 = (this->_vertices).
                       super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(float *)(__s + 1) = pVVar6[uVar22].vertex.z;
              *__s = *(undefined8 *)&pVVar6[uVar22].vertex;
              if (local_120 == (undefined8 *)0x0) {
                local_120 = (undefined8 *)0x0;
              }
              else {
                *(float *)(local_120 + 1) = pVVar6[uVar22].normal.z;
                *local_120 = *(undefined8 *)&pVVar6[uVar22].normal;
                local_120 = (undefined8 *)((long)local_120 + 0xc);
              }
              if (local_158 == (undefined8 *)0x0) {
                local_158 = (undefined8 *)0x0;
              }
              else {
                *(float *)(local_158 + 1) = pVVar6[uVar22].texcoords.z;
                *local_158 = *(undefined8 *)&pVVar6[uVar22].texcoords;
                local_158 = (undefined8 *)((long)local_158 + 0xc);
              }
              __s = (undefined8 *)((long)__s + 0xc);
              uVar42 = (int)lVar38 + (int)local_198;
              *(uint *)(*(long *)(lVar40 + 8) + lVar38 * 4) = uVar42;
              lVar39 = -4;
              do {
                fVar3 = *(float *)(pVVar6[uVar22 + 1].bones + lVar39 * 4 + -0x24);
                if ((fVar3 == 0.0) && (!NAN(fVar3))) break;
                pvVar2 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                         ((long)&(((PropertyMap *)local_1b8.super_BaseProcess._vptr_BaseProcess)->
                                 _M_t)._M_impl.field_0x0 +
                         (ulong)*(byte *)((long)pVVar6[uVar22].weights + lVar39) * 3 * 8);
                local_118._4_4_ = fVar3;
                local_118._0_4_ = uVar42;
                __position._M_current =
                     (pvVar2->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pvVar2->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                  _M_realloc_insert<aiVertexWeight>(pvVar2,__position,(aiVertexWeight *)local_118);
                }
                else {
                  (__position._M_current)->mVertexId = uVar42;
                  (__position._M_current)->mWeight = fVar3;
                  ppaVar1 = &(pvVar2->
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                lVar39 = lVar39 + 1;
              } while (lVar39 != 0);
              lVar38 = lVar38 + 1;
            } while (lVar38 != 3);
            lVar40 = lVar40 + 0x10;
            local_198 = local_198 + 3;
          } while ((int)local_198 < local_18c);
        }
        local_188 = (void *)0x0;
        iStack_180._M_current = (aiBone **)0x0;
        local_178 = (aiBone **)0x0;
        scene = local_1a0;
        if (local_1b8.super_BaseProcess.shared ==
            (SharedPostProcessInfo *)local_1b8.super_BaseProcess._vptr_BaseProcess) {
          *(undefined4 *)
           ((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd8) = 0;
          *(undefined8 *)
           ((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = 0;
        }
        else {
          uVar22 = 0;
          pSVar26 = local_1b8.super_BaseProcess.shared;
          pSVar41 = (SharedPostProcessInfo *)local_1b8.super_BaseProcess._vptr_BaseProcess;
          do {
            if (*(_func_int **)
                 (&(pSVar41->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 uVar22 * 6) !=
                *(_func_int **)((long)&(pSVar41->pmap)._M_t._M_impl.field_0x0 + uVar22 * 3 * 8)) {
              paVar23 = (aiNode *)operator_new(0x450);
              (paVar23->mName).length = 0;
              (paVar23->mName).data[0] = '\0';
              memset((paVar23->mName).data + 1,0x1b,0x3ff);
              (paVar23->mTransformation).a1 = 0.0;
              (paVar23->mTransformation).a2 = 0.0;
              (paVar23->mTransformation).a3 = 0.0;
              (paVar23->mTransformation).a4 = 1.0;
              (paVar23->mTransformation).b1 = 0.0;
              (paVar23->mTransformation).b2 = 0.0;
              (paVar23->mTransformation).b3 = 0.0;
              (paVar23->mTransformation).b4 = 0.0;
              (paVar23->mTransformation).c1 = 1.0;
              (paVar23->mTransformation).c2 = 0.0;
              (paVar23->mTransformation).c3 = 0.0;
              (paVar23->mTransformation).c4 = 0.0;
              (paVar23->mTransformation).d1 = 0.0;
              (paVar23->mTransformation).d2 = 1.0;
              (paVar23->mTransformation).d3 = 0.0;
              (paVar23->mTransformation).d4 = 0.0;
              *(undefined8 *)&paVar23->field_0x444 = 0;
              *(undefined4 *)((long)&paVar23->mParent + 4) = 0x3f800000;
              local_1c0 = paVar23;
              if (iStack_180._M_current == local_178) {
                std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                          ((vector<aiBone*,std::allocator<aiBone*>> *)&local_188,iStack_180,
                           (aiBone **)&local_1c0);
              }
              else {
                *iStack_180._M_current = (aiBone *)paVar23;
                iStack_180._M_current = iStack_180._M_current + 1;
              }
              paVar17 = local_1c0;
              paVar23 = (local_128->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[uVar22];
              if (local_1c0 != paVar23) {
                uVar42 = (paVar23->mName).length;
                (local_1c0->mName).length = uVar42;
                memcpy((local_1c0->mName).data,(paVar23->mName).data,(ulong)uVar42);
                (paVar17->mName).data[uVar42] = '\0';
              }
              pvVar2 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                       ((long)&(pSVar41->pmap)._M_t._M_impl.field_0x0 + uVar22 * 3 * 8);
              (local_1c0->mTransformation).a1 =
                   (float)((ulong)((long)(pvVar2->
                                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar2->
                                        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3);
              paVar24 = to_array<aiVertexWeight>(this,pvVar2);
              scene = local_1a0;
              *(aiVertexWeight **)&(local_1c0->mTransformation).a2 = paVar24;
              local_118._0_4_ = (paVar23->mTransformation).a1;
              local_118._4_4_ = (paVar23->mTransformation).a2;
              unique0x100009f9 = *(SharedPostProcessInfo **)&(paVar23->mTransformation).a3;
              local_108._0_4_ = (paVar23->mTransformation).b1;
              local_108._4_4_ = (paVar23->mTransformation).b2;
              fStack_100 = (paVar23->mTransformation).b3;
              fStack_fc = (paVar23->mTransformation).b4;
              local_f8 = (paVar23->mTransformation).c1;
              fStack_f4 = (paVar23->mTransformation).c2;
              fStack_f0 = (paVar23->mTransformation).c3;
              fStack_ec = (paVar23->mTransformation).c4;
              local_e8 = (paVar23->mTransformation).d1;
              fStack_e4 = (paVar23->mTransformation).d2;
              fStack_e0 = (paVar23->mTransformation).d3;
              fStack_dc = (paVar23->mTransformation).d4;
              paVar23 = paVar23->mParent;
              if (paVar23 != (aiNode *)0x0) {
                fStack_10c = (float)((ulong)unique0x100009f9 >> 0x20);
                do {
                  fVar3 = (paVar23->mTransformation).b2;
                  fVar48 = (paVar23->mTransformation).b1;
                  fVar47 = (paVar23->mTransformation).b3;
                  fVar55 = (paVar23->mTransformation).a2;
                  fVar49 = fVar55 * (float)local_108._0_4_;
                  fVar51 = fVar55 * (float)local_108._4_4_;
                  fVar53 = fVar55 * fStack_100;
                  fVar55 = fVar55 * fStack_fc;
                  fVar60 = (paVar23->mTransformation).c2;
                  fVar57 = fVar60 * (float)local_108._0_4_;
                  fVar58 = fVar60 * (float)local_108._4_4_;
                  fVar59 = fVar60 * fStack_100;
                  fVar60 = fVar60 * fStack_fc;
                  fVar64 = (paVar23->mTransformation).d2;
                  fVar61 = fVar64 * (float)local_108._0_4_;
                  fVar62 = fVar64 * (float)local_108._4_4_;
                  fVar63 = fVar64 * fStack_100;
                  fVar64 = fVar64 * fStack_fc;
                  fVar56 = (paVar23->mTransformation).b4;
                  local_108._0_4_ =
                       fVar56 * local_e8 +
                       fVar47 * local_f8 +
                       fVar48 * (float)local_118._0_4_ + fVar3 * (float)local_108._0_4_;
                  local_108._4_4_ =
                       fVar56 * fStack_e4 +
                       fVar47 * fStack_f4 +
                       fVar48 * (float)local_118._4_4_ + fVar3 * (float)local_108._4_4_;
                  fStack_100 = fVar56 * fStack_e0 +
                               fVar47 * fStack_f0 +
                               fVar48 * (float)local_118._8_4_ + fVar3 * fStack_100;
                  fStack_fc = fVar56 * fStack_dc +
                              fVar47 * fStack_ec + fVar48 * fStack_10c + fVar3 * fStack_fc;
                  fVar3 = (paVar23->mTransformation).a1;
                  fVar48 = (paVar23->mTransformation).a3;
                  fVar47 = (paVar23->mTransformation).c1;
                  fVar43 = fVar47 * (float)local_118._0_4_;
                  fVar45 = fVar47 * (float)local_118._4_4_;
                  fVar46 = fVar47 * (float)local_118._8_4_;
                  fVar47 = fVar47 * fStack_10c;
                  fVar56 = (paVar23->mTransformation).d1;
                  fVar50 = fVar56 * (float)local_118._0_4_;
                  fVar52 = fVar56 * (float)local_118._4_4_;
                  fVar54 = fVar56 * (float)local_118._8_4_;
                  fVar56 = fVar56 * fStack_10c;
                  fVar44 = (paVar23->mTransformation).a4;
                  local_118._0_4_ =
                       fVar44 * local_e8 +
                       fVar48 * local_f8 + fVar3 * (float)local_118._0_4_ + fVar49;
                  local_118._4_4_ =
                       fVar44 * fStack_e4 +
                       fVar48 * fStack_f4 + fVar3 * (float)local_118._4_4_ + fVar51;
                  local_118._8_4_ =
                       fVar44 * fStack_e0 +
                       fVar48 * fStack_f0 + fVar3 * (float)local_118._8_4_ + fVar53;
                  fStack_10c = fVar44 * fStack_dc + fVar48 * fStack_ec + fVar3 * fStack_10c + fVar55
                  ;
                  fVar3 = (paVar23->mTransformation).c3;
                  fVar48 = (paVar23->mTransformation).d3;
                  fVar44 = fVar48 * local_f8;
                  fVar49 = fVar48 * fStack_f4;
                  fVar51 = fVar48 * fStack_f0;
                  fVar48 = fVar48 * fStack_ec;
                  fVar55 = (paVar23->mTransformation).c4;
                  local_f8 = fVar55 * local_e8 + fVar3 * local_f8 + fVar43 + fVar57;
                  fStack_f4 = fVar55 * fStack_e4 + fVar3 * fStack_f4 + fVar45 + fVar58;
                  fStack_f0 = fVar55 * fStack_e0 + fVar3 * fStack_f0 + fVar46 + fVar59;
                  fStack_ec = fVar55 * fStack_dc + fVar3 * fStack_ec + fVar47 + fVar60;
                  fVar3 = (paVar23->mTransformation).d4;
                  local_e8 = local_e8 * fVar3 + fVar44 + fVar50 + fVar61;
                  fStack_e4 = fStack_e4 * fVar3 + fVar49 + fVar52 + fVar62;
                  fStack_e0 = fStack_e0 * fVar3 + fVar51 + fVar54 + fVar63;
                  fStack_dc = fStack_dc * fVar3 + fVar48 + fVar56 + fVar64;
                  paVar23 = paVar23->mParent;
                } while (paVar23 != (aiNode *)0x0);
              }
              paVar25 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_118);
              fVar43 = paVar25->a1;
              fVar45 = paVar25->a2;
              fVar49 = paVar25->a3;
              fVar46 = paVar25->a4;
              fVar60 = paVar25->b1;
              fVar64 = paVar25->b2;
              fVar56 = paVar25->b3;
              fVar44 = paVar25->b4;
              fVar3 = paVar25->c1;
              fVar48 = paVar25->c2;
              fVar47 = paVar25->c3;
              fVar55 = paVar25->c4;
              paVar23 = *(aiNode **)&paVar25->d3;
              *(undefined8 *)&(local_1c0->mTransformation).d4 = *(undefined8 *)&paVar25->d1;
              local_1c0->mParent = paVar23;
              (local_1c0->mTransformation).c4 = fVar3;
              (local_1c0->mTransformation).d1 = fVar48;
              (local_1c0->mTransformation).d2 = fVar47;
              (local_1c0->mTransformation).d3 = fVar55;
              (local_1c0->mTransformation).b4 = fVar60;
              (local_1c0->mTransformation).c1 = fVar64;
              (local_1c0->mTransformation).c2 = fVar56;
              (local_1c0->mTransformation).c3 = fVar44;
              (local_1c0->mTransformation).a4 = fVar43;
              (local_1c0->mTransformation).b1 = fVar45;
              (local_1c0->mTransformation).b2 = fVar49;
              (local_1c0->mTransformation).b3 = fVar46;
              pSVar26 = local_1b8.super_BaseProcess.shared;
              pSVar41 = (SharedPostProcessInfo *)local_1b8.super_BaseProcess._vptr_BaseProcess;
            }
            __src = local_188;
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)(((long)pSVar26 - (long)pSVar41 >> 3) * -0x5555555555555555));
          uVar22 = (long)iStack_180._M_current - (long)local_188 >> 3;
          *(int *)((long)_Var13._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd8) = (int)uVar22;
          if ((long)iStack_180._M_current - (long)local_188 == 0) {
            __dest = (void *)0x0;
          }
          else {
            __dest = operator_new__(-(ulong)(uVar22 >> 0x3d != 0) |
                                    (long)iStack_180._M_current - (long)local_188);
            memcpy(__dest,__src,(uVar22 + (uVar22 == 0)) * 8);
          }
          *(void **)((long)_Var13._M_t.
                           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = __dest;
          if (__src != (void *)0x0) {
            operator_delete(__src);
          }
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   *)&local_1b8);
        uVar33 = local_130 + 1;
      } while (uVar33 < local_138->mNumMeshes);
      ppaVar27 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar34 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar22 = local_140;
    }
    uVar22 = uVar22 + 1;
    if ((ulong)((long)ppaVar34 - (long)ppaVar27 >> 3) <= uVar22) {
      scene->mRootNode = *ppaVar27;
      ppaVar27 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppaVar27) {
        (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppaVar27;
      }
      puVar35 = (this->_materials).
                super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar28 = (this->_materials).
                super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar28 == puVar35) {
        this_01 = (aiVertexWeight)operator_new(0x10);
        aiMaterial::aiMaterial((aiMaterial *)this_01);
        local_118._0_8_ = this_01;
        std::
        vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
        ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
                  (local_168,(unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)local_118);
        uVar18 = local_118._0_8_;
        if ((aiVertexWeight)local_118._0_8_ != (aiVertexWeight)0x0) {
          aiMaterial::~aiMaterial((aiMaterial *)local_118._0_8_);
          operator_delete((void *)uVar18);
        }
        puVar35 = (this->_materials).
                  super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar28 = (this->_materials).
                  super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      scene->mNumMaterials = (uint)((ulong)((long)puVar28 - (long)puVar35) >> 3);
      ppaVar29 = unique_to_array<aiMaterial>
                           ((vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                             *)local_168);
      scene->mMaterials = ppaVar29;
      scene->mNumMeshes =
           (uint)((ulong)((long)(this->_meshes).
                                super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->_meshes).
                               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppaVar30 = unique_to_array<aiMesh>(local_160);
      scene->mMeshes = ppaVar30;
      puVar14 = (this->_animations).
                super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)puVar14 -
           (long)(this->_animations).
                 super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 8) &&
         (uVar22 = (long)(this->_nodeAnims).
                         super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_nodeAnims).
                         super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, uVar22 != 0)) {
        paVar15 = puVar14[-1]._M_t.
                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
        paVar15->mNumChannels = (uint)(uVar22 >> 3);
        ppaVar31 = unique_to_array<aiNodeAnim>(local_148);
        paVar15->mChannels = ppaVar31;
        scene->mNumAnimations =
             (uint)((ulong)((long)(this->_animations).
                                  super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_animations).
                                 super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
        ppaVar32 = unique_to_array<aiAnimation>(local_150);
        scene->mAnimations = ppaVar32;
      }
      MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_118);
      MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_118,scene);
      FlipWindingOrderProcess::FlipWindingOrderProcess(&local_1b8);
      FlipWindingOrderProcess::Execute(&local_1b8,scene);
      FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_1b8);
      MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void B3DImporter::ReadBB3D( aiScene *scene ){

    _textures.clear();

    _materials.clear();

    _vertices.clear();

    _meshes.clear();

    DeleteAllBarePointers(_nodes);
    _nodes.clear();

    _nodeAnims.clear();

    _animations.clear();

    string t=ReadChunk();
    if( t=="BB3D" ){
        int version=ReadInt();

        if (!DefaultLogger::isNullLogger()) {
            char dmp[128];
            ai_snprintf(dmp, 128, "B3D file format version: %i",version);
            ASSIMP_LOG_INFO(dmp);
        }

        while( ChunkSize() ){
            string t=ReadChunk();
            if( t=="TEXS" ){
                ReadTEXS();
            }else if( t=="BRUS" ){
                ReadBRUS();
            }else if( t=="NODE" ){
                ReadNODE( 0 );
            }
            ExitChunk();
        }
    }
    ExitChunk();

    if( !_nodes.size() ) Fail( "No nodes" );

    if( !_meshes.size() ) Fail( "No meshes" );

    //Fix nodes/meshes/bones
    for(size_t i=0;i<_nodes.size();++i ){
        aiNode *node=_nodes[i];

        for( size_t j=0;j<node->mNumMeshes;++j ){
            aiMesh *mesh = _meshes[node->mMeshes[j]].get();

            int n_tris=mesh->mNumFaces;
            int n_verts=mesh->mNumVertices=n_tris * 3;

            aiVector3D *mv=mesh->mVertices=new aiVector3D[ n_verts ],*mn=0,*mc=0;
            if( _vflags & 1 ) mn=mesh->mNormals=new aiVector3D[ n_verts ];
            if( _tcsets ) mc=mesh->mTextureCoords[0]=new aiVector3D[ n_verts ];

            aiFace *face=mesh->mFaces;

            vector< vector<aiVertexWeight> > vweights( _nodes.size() );

            for( int i=0;i<n_verts;i+=3 ){
                for( int j=0;j<3;++j ){
                    Vertex &v=_vertices[face->mIndices[j]];

                    *mv++=v.vertex;
                    if( mn ) *mn++=v.normal;
                    if( mc ) *mc++=v.texcoords;

                    face->mIndices[j]=i+j;

                    for( int k=0;k<4;++k ){
                        if( !v.weights[k] ) break;

                        int bone=v.bones[k];
                        float weight=v.weights[k];

                        vweights[bone].push_back( aiVertexWeight(i+j,weight) );
                    }
                }
                ++face;
            }

            vector<aiBone*> bones;
            for(size_t i=0;i<vweights.size();++i ){
                vector<aiVertexWeight> &weights=vweights[i];
                if( !weights.size() ) continue;

                aiBone *bone=new aiBone;
                bones.push_back( bone );

                aiNode *bnode=_nodes[i];

                bone->mName=bnode->mName;
                bone->mNumWeights= static_cast<unsigned int>(weights.size());
                bone->mWeights=to_array( weights );

                aiMatrix4x4 mat=bnode->mTransformation;
                while( bnode->mParent ){
                    bnode=bnode->mParent;
                    mat=bnode->mTransformation * mat;
                }
                bone->mOffsetMatrix=mat.Inverse();
            }
            mesh->mNumBones= static_cast<unsigned int>(bones.size());
            mesh->mBones=to_array( bones );
        }
    }

    //nodes
    scene->mRootNode=_nodes[0];
    _nodes.clear();  // node ownership now belongs to scene

    //material
    if( !_materials.size() ){
        _materials.emplace_back( std::unique_ptr<aiMaterial>(new aiMaterial) );
    }
    scene->mNumMaterials= static_cast<unsigned int>(_materials.size());
    scene->mMaterials = unique_to_array( _materials );

    //meshes
    scene->mNumMeshes= static_cast<unsigned int>(_meshes.size());
    scene->mMeshes = unique_to_array( _meshes );

    //animations
    if( _animations.size()==1 && _nodeAnims.size() ){

        aiAnimation *anim = _animations.back().get();
        anim->mNumChannels=static_cast<unsigned int>(_nodeAnims.size());
        anim->mChannels = unique_to_array( _nodeAnims );

        scene->mNumAnimations=static_cast<unsigned int>(_animations.size());
        scene->mAnimations=unique_to_array( _animations );
    }

    // convert to RH
    MakeLeftHandedProcess makeleft;
    makeleft.Execute( scene );

    FlipWindingOrderProcess flip;
    flip.Execute( scene );
}